

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseDictElement
          (AsciiParser *this,string *out_key,MetaVariable *out_var)

{
  undefined1 uVar1;
  bool bVar2;
  uint32_t uVar3;
  ostream *poVar4;
  uint *args;
  string *msg;
  allocator local_309;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vss;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> arrs;
  string local_2c8;
  PrimVar var;
  token val;
  MetaVariable metavar;
  string key_name;
  string type_name;
  
  type_name._M_dataplus._M_p = (pointer)&type_name.field_2;
  type_name._M_string_length = 0;
  type_name.field_2._M_local_buf[0] = '\0';
  bVar2 = ReadIdentifier(this,&type_name);
  if ((!bVar2) || (bVar2 = SkipWhitespace(this), !bVar2)) {
LAB_002809a3:
    bVar2 = false;
    goto LAB_002809a5;
  }
  bVar2 = IsSupportedPrimAttrType(this,&type_name);
  if (!bVar2) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
    poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x2fa);
    ::std::operator<<(poVar4," ");
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var,
                     "Unknown or unsupported type `",&type_name);
    ::std::operator+(&val.str_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var,"`\n"
                    );
    poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val.str_);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
LAB_00280970:
    ::std::__cxx11::stringbuf::str();
    PushError(this,&val.str_);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
    goto LAB_002809a3;
  }
  bVar2 = Char1(this,(char *)&var);
  if (!bVar2) goto LAB_002809a3;
  uVar1 = var._value.v_.storage._0_1_;
  if (var._value.v_.storage._0_1_ != '[') {
    bVar2 = Rewind(this,1);
    if (bVar2) goto LAB_002809d5;
    goto LAB_002809a3;
  }
  bVar2 = Char1(this,(char *)&key_name);
  if (!bVar2) goto LAB_002809a3;
  if ((char)key_name._M_dataplus._M_p != ']') {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
    poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x30e);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)&metavar,"Invalid syntax found.");
    ::std::operator<<(poVar4,"\n");
    goto LAB_00280970;
  }
LAB_002809d5:
  bVar2 = SkipWhitespace(this);
  if (!bVar2) goto LAB_002809a3;
  key_name._M_dataplus._M_p = (pointer)&key_name.field_2;
  key_name._M_string_length = 0;
  key_name.field_2._M_local_buf[0] = '\0';
  bVar2 = ReadIdentifier(this,&key_name);
  if ((bVar2) || (bVar2 = ReadStringLiteral(this,&key_name), bVar2)) {
    bVar2 = SkipWhitespace(this);
    if (((!bVar2) || (bVar2 = Expect(this,'='), !bVar2)) || (bVar2 = SkipWhitespace(this), !bVar2))
    goto LAB_00280bb4;
    uVar3 = tinyusdz::value::GetTypeId(&type_name);
    var._value.v_.vtable = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
    var._value.v_.storage.dynamic = (void *)0x0;
    var._blocked = false;
    var._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    var._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    var._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    var._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    var._ts._17_8_ = 0;
    args = &switchD_00280aab::switchdataD_002f9920;
    switch(uVar3) {
    case 6:
      if (uVar1 == '[') {
        vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = ParseBasicTypeArray<tinyusdz::Token>(this,&vss);
        if (bVar2) {
          linb::any::operator=((any *)&var,&vss);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>
                    ((string *)&val,(fmt *)&arrs,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,&val.str_);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&vss);
      }
      else {
        val.str_._M_dataplus._M_p = (pointer)&val.str_.field_2;
        val.str_._M_string_length._0_4_ = 0;
        val.str_._M_string_length._4_4_ = 0;
        val.str_.field_2._M_allocated_capacity._0_4_ =
             (uint)(uint3)val.str_.field_2._M_allocated_capacity._1_3_ << 8;
        bVar2 = ReadBasicType(this,&val);
        if (bVar2) {
          linb::any::operator=((any *)&var,&val);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>
                    ((string *)&arrs,(fmt *)&local_2c8,(string *)&vss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&arrs);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&arrs);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
        }
        ::std::__cxx11::string::_M_dispose();
      }
      break;
    case 7:
      if (uVar1 == '[') {
        arrs.
        super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        arrs.
        super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        arrs.
        super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = ParseBasicTypeArray<tinyusdz::value::StringData>
                          (this,(vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                 *)&arrs);
        if (bVar2) {
          linb::any::operator=
                    ((any *)&var,
                     (vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      *)&arrs);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x359);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)&metavar,"Failed to parse `string[]`");
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&val.str_);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
        }
        ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
        ~vector((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *
                )&arrs);
      }
      else {
        val.str_._M_dataplus._M_p = (pointer)&val.str_.field_2;
        val.str_._M_string_length._0_4_ = 0;
        val.str_._M_string_length._4_4_ = 0;
        val.str_.field_2._M_allocated_capacity._0_4_ =
             (uint)(uint3)val.str_.field_2._M_allocated_capacity._1_3_ << 8;
        bVar2 = ReadBasicType(this,(StringData *)&val);
        if (bVar2) {
          linb::any::operator=((any *)&var,(StringData *)&val);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x35f);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)&metavar,"Failed to parse `string`");
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&arrs);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
        }
        ::std::__cxx11::string::_M_dispose();
      }
      break;
    default:
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
      poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x381);
      ::std::operator<<(poVar4," ");
      ::std::operator+(&val.str_,"Unsupported or invalid type for Metadatum:",&type_name);
      poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val.str_);
      ::std::operator<<(poVar4,"\n");
LAB_002887a9:
      ::std::__cxx11::string::_M_dispose();
      msg = &val.str_;
LAB_002887c1:
      ::std::__cxx11::stringbuf::str();
      PushError(this,msg);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      goto LAB_002887e4;
    case 9:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(bool *)&vss);
        if (bVar2) {
          linb::any::operator=((any *)&var,(bool *)&vss);
          goto LAB_00288663;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
        tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
LAB_00288769:
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        goto LAB_002887a9;
      }
      val.str_._M_dataplus._M_p._0_4_ = 0;
      val.str_._M_dataplus._M_p._4_4_ = 0;
      val.str_._M_string_length._0_4_ = 0;
      val.str_.field_2._M_allocated_capacity._0_4_ = 0;
      val.str_.field_2._M_allocated_capacity._4_4_ = 0;
      val.str_.field_2._8_8_ = val.str_.field_2._8_8_ & 0xffffffff00000000;
      bVar2 = ParseBasicTypeArray<bool>(this,(vector<bool,_std::allocator<bool>_> *)&val);
      if (bVar2) {
        linb::any::operator=((any *)&var,(vector<bool,_std::allocator<bool>_> *)&val);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_2c8,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&arrs,(fmt *)&local_2c8,(string *)&vss,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&arrs);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&arrs);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                ((_Bvector_base<std::allocator<bool>_> *)&val);
      break;
    case 0xe:
      if (uVar1 == '[') {
        vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = ParseBasicTypeArray<tinyusdz::value::half>
                          (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                 *)&vss);
        if (bVar2) {
          linb::any::operator=
                    ((any *)&var,
                     (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&vss);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>
                    ((string *)&val,(fmt *)&arrs,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,&val.str_);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
        }
        ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                      )&vss);
        break;
      }
      bVar2 = ReadBasicType(this,(half *)&vss);
      if (!bVar2) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
        goto LAB_00288769;
      }
      linb::any::operator=((any *)&var,(half *)&vss);
      goto LAB_00288663;
    case 0xf:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(int *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(int *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)&vss);
      if (bVar2) {
        linb::any::operator=((any *)&var,(vector<int,_std::allocator<int>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&vss);
      break;
    case 0x10:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(int64_t *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<long>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(long *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<long>(this,(vector<long,_std::allocator<long>_> *)&vss);
      if (bVar2) {
        linb::any::operator=((any *)&var,(vector<long,_std::allocator<long>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<long>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&vss);
      break;
    case 0x11:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(half2 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,2ul>>::type_name_abi_cxx11_()
          ;
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<tinyusdz::value::half,_2UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       *)&vss);
      break;
    case 0x12:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(half3 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,3ul>>::type_name_abi_cxx11_()
          ;
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<tinyusdz::value::half,_3UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)&vss);
      break;
    case 0x13:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(half4 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,4ul>>::type_name_abi_cxx11_()
          ;
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<tinyusdz::value::half,_4UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                        (this,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       *)&vss);
      break;
    case 0x14:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(int2 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<int,2ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<int,_2UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<int,2ul>>
                        (this,(vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<int,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                    &vss);
      break;
    case 0x15:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(int3 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<int,3ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<int,_3UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<int,3ul>>
                        (this,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<int,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                    &vss);
      break;
    case 0x16:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(int4 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<int,4ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<int,_4UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<int,4ul>>
                        (this,(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<int,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                    &vss);
      break;
    case 0x1b:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(uint32_t *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<unsigned_int>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(uint *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<unsigned_int>
                        (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<unsigned_int>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&vss);
      break;
    case 0x1c:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(uint64_t *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<unsigned_long>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(unsigned_long *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<unsigned_long>
                        (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<unsigned_long>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&vss);
      break;
    case 0x25:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(uint2 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<unsigned_int,_2UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                        (this,(vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                     *)&vss);
      break;
    case 0x26:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(uint3 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<unsigned_int,_3UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                        (this,(vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                     *)&vss);
      break;
    case 0x27:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(uint4 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<unsigned_int,_4UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                        (this,(vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                     *)&vss);
      break;
    case 0x28:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(float *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(float *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<float>(this,(vector<float,_std::allocator<float>_> *)&vss);
      if (bVar2) {
        linb::any::operator=((any *)&var,(vector<float,_std::allocator<float>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<float>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&vss);
      break;
    case 0x29:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(float2 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<float,_2UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<float,2ul>>
                        (this,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&vss)
        ;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     *)&vss);
      break;
    case 0x2a:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(float3 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<float,_3UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<float,3ul>>
                        (this,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)&vss)
        ;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     *)&vss);
      break;
    case 0x2b:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(float4 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<float,_4UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<float,4ul>>
                        (this,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)&vss)
        ;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     *)&vss);
      break;
    case 0x2c:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(double *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<double>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(double *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<double>(this,(vector<double,_std::allocator<double>_> *)&vss);
      if (bVar2) {
        linb::any::operator=((any *)&var,(vector<double,_std::allocator<double>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<double>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&vss);
      break;
    case 0x2d:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(double2 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<double,2ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<double,_2UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<double,2ul>>
                        (this,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<double,2ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     *)&vss);
      break;
    case 0x2e:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(double3 *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<std::array<double,3ul>>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(array<double,_3UL> *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<double,3ul>>
                        (this,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<double,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     *)&vss);
      break;
    case 0x2f:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(double4 *)&val);
        if (bVar2) {
          linb::any::operator=((any *)&var,(array<double,_4UL> *)&val);
          goto LAB_00288663;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
        tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
LAB_0028812f:
        fmt::format<std::__cxx11::string>
                  ((string *)&arrs,(fmt *)&local_2c8,(string *)&vss,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&arrs);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        msg = (string *)&arrs;
        goto LAB_002887c1;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<std::array<double,4ul>>
                        (this,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     *)&vss);
      break;
    case 0x30:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(quath *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(quath *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::quath>
                        (this,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *
                    )&vss);
      break;
    case 0x31:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(quatf *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::quatf>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(quatf *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::quatf>
                        (this,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::quatf>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *
                    )&vss);
      break;
    case 0x32:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(quatd *)&val);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::quatd>::type_name_abi_cxx11_();
          goto LAB_0028812f;
        }
        linb::any::operator=((any *)&var,(quatd *)&val);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::quatd>
                        (this,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::quatd>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *
                    )&vss);
      break;
    case 0x33:
      if (uVar1 != '[') {
        vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x3f800000;
        vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
        bVar2 = ReadBasicType(this,(matrix2f *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix2f>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(matrix2f *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                        (this,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix2f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                     *)&vss);
      break;
    case 0x34:
      if (uVar1 != '[') {
        val.str_._M_dataplus._M_p._0_4_ = 0x3f800000;
        val.str_._M_dataplus._M_p._4_4_ = 0;
        val.str_._M_string_length._0_4_ = 0;
        val.str_._M_string_length._4_4_ = 0;
        val.str_.field_2._M_allocated_capacity._0_4_ = 0x3f800000;
        val.str_.field_2._M_allocated_capacity._4_4_ = 0;
        val.str_.field_2._8_8_ = 0;
        bVar2 = ReadBasicType(this,(matrix3f *)&val);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix3f>::type_name_abi_cxx11_();
          goto LAB_0028812f;
        }
        linb::any::operator=((any *)&var,(matrix3f *)&val);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                        (this,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                     *)&vss);
      break;
    case 0x35:
      if (uVar1 != '[') {
        val.str_._M_dataplus._M_p._0_4_ = 0x3f800000;
        val.str_._M_dataplus._M_p._4_4_ = 0;
        val.str_._M_string_length._0_4_ = 0;
        val.str_._M_string_length._4_4_ = 0;
        val.str_.field_2._M_allocated_capacity._0_4_ = 0;
        val.str_.field_2._M_allocated_capacity._4_4_ = 0x3f800000;
        val.str_.field_2._8_8_ = 0;
        bVar2 = ReadBasicType(this,(matrix4f *)&val);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix4f>::type_name_abi_cxx11_();
          goto LAB_0028812f;
        }
        linb::any::operator=((any *)&var,(matrix4f *)&val);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                        (this,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix4f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                     *)&vss);
      break;
    case 0x36:
      if (uVar1 != '[') {
        val.str_._M_dataplus._M_p._0_4_ = 0;
        val.str_._M_dataplus._M_p._4_4_ = 0x3ff00000;
        val.str_._M_string_length._0_4_ = 0;
        val.str_._M_string_length._4_4_ = 0;
        val.str_.field_2._M_allocated_capacity._0_4_ = 0;
        val.str_.field_2._M_allocated_capacity._4_4_ = 0;
        val.str_.field_2._8_8_ = 0x3ff0000000000000;
        bVar2 = ReadBasicType(this,(matrix2d *)&val);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_name_abi_cxx11_();
          goto LAB_0028812f;
        }
        linb::any::operator=((any *)&var,(matrix2d *)&val);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                        (this,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                     *)&vss);
      break;
    case 0x37:
      if (uVar1 != '[') {
        val.str_._M_dataplus._M_p._0_4_ = 0;
        val.str_._M_dataplus._M_p._4_4_ = 0x3ff00000;
        val.str_.field_2._8_8_ = 0;
        val.str_._M_string_length._0_4_ = 0;
        val.str_._M_string_length._4_4_ = 0;
        val.str_.field_2._M_allocated_capacity._0_4_ = 0;
        val.str_.field_2._M_allocated_capacity._4_4_ = 0;
        bVar2 = ReadBasicType(this,(matrix3d *)&val);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix3d>::type_name_abi_cxx11_();
          goto LAB_0028812f;
        }
        linb::any::operator=((any *)&var,(matrix3d *)&val);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                        (this,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                     *)&vss);
      break;
    case 0x38:
      if (uVar1 != '[') {
        val.str_._M_dataplus._M_p._0_4_ = 0;
        val.str_._M_dataplus._M_p._4_4_ = 0x3ff00000;
        val.str_._M_string_length._0_4_ = 0;
        val.str_._M_string_length._4_4_ = 0;
        val.str_.field_2._M_allocated_capacity._0_4_ = 0;
        val.str_.field_2._M_allocated_capacity._4_4_ = 0;
        val.str_.field_2._8_8_ = 0;
        bVar2 = ReadBasicType(this,(matrix4d *)&val);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
          goto LAB_0028812f;
        }
        linb::any::operator=((any *)&var,(matrix4d *)&val);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                        (this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                     *)&vss);
      break;
    case 0x3a:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(color3f *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(color3f *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::color3f>
                        (this,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                     *)&vss);
      break;
    case 0x3b:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(color3d *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::color3d>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(color3d *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::color3d>
                        (this,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::color3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                     *)&vss);
      break;
    case 0x3d:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(color4f *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(color4f *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::color4f>
                        (this,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                     *)&vss);
      break;
    case 0x3e:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(color4d *)&val);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::color4d>::type_name_abi_cxx11_();
          goto LAB_0028812f;
        }
        linb::any::operator=((any *)&var,(color4d *)&val);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::color4d>
                        (this,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::color4d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     *)&vss);
      break;
    case 0x3f:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(point3h *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::point3h>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(point3h *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::point3h>
                        (this,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                     *)&vss);
      break;
    case 0x40:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(point3f *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::point3f>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(point3f *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::point3f>
                        (this,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                     *)&vss);
      break;
    case 0x41:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(point3d *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::point3d>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(point3d *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::point3d>
                        (this,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::point3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                     *)&vss);
      break;
    case 0x42:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(normal3h *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::normal3h>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(normal3h *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::normal3h>
                        (this,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                     *)&vss);
      break;
    case 0x43:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(normal3f *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(normal3f *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                        (this,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                     *)&vss);
      break;
    case 0x44:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(normal3d *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::normal3d>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(normal3d *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::normal3d>
                        (this,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                     *)&vss);
      break;
    case 0x45:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(vector3h *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::vector3h>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(vector3h *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::vector3h>
                        (this,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                     *)&vss);
      break;
    case 0x46:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(vector3f *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(vector3f *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                        (this,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                     *)&vss);
      break;
    case 0x47:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(vector3d *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::vector3d>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(vector3d *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::vector3d>
                        (this,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::vector3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                     *)&vss);
      break;
    case 0x49:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(texcoord2h *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2h>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(texcoord2h *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::texcoord2h>
                        (this,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)&vss);
      break;
    case 0x4a:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(texcoord2f *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(texcoord2f *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                        (this,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&vss);
      break;
    case 0x4b:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(texcoord2d *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2d>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(texcoord2d *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::texcoord2d>
                        (this,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord2d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       *)&vss);
      break;
    case 0x4c:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(texcoord3h *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3h>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(texcoord3h *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::texcoord3h>
                        (this,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3h>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       *)&vss);
      break;
    case 0x4d:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(texcoord3f *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(texcoord3f *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                        (this,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)&vss);
      break;
    case 0x4e:
      if (uVar1 != '[') {
        bVar2 = ReadBasicType(this,(texcoord3d *)&vss);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&arrs,"Failed to parse a value of type `{}`",&local_309);
          tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3d>::type_name_abi_cxx11_();
          goto LAB_00288769;
        }
        linb::any::operator=((any *)&var,(texcoord3d *)&vss);
        goto LAB_00288663;
      }
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vss.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<tinyusdz::value::texcoord3d>
                        (this,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                               *)&vss);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    *)&vss);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x353);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&arrs,"Failed to parse a value of type `{}[]`",&local_309);
        tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3d>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  ((string *)&val,(fmt *)&arrs,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar4 = ::std::operator<<((ostream *)&metavar,(string *)&val);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&val.str_);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
      ::~_Vector_base((_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       *)&vss);
      break;
    case 0x51:
      if (uVar1 == '[') {
        arrs.
        super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        arrs.
        super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        arrs.
        super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = ParseBasicTypeArray<tinyusdz::value::AssetPath>(this,&arrs);
        if (bVar2) {
          linb::any::operator=((any *)&var,&arrs);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x369);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)&metavar,"Failed to parse `asset[]`");
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&val.str_);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
        }
        ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
        ~vector(&arrs);
      }
      else {
        val.str_._M_dataplus._M_p = (pointer)&val.str_.field_2;
        val.str_._M_string_length._0_4_ = 0;
        val.str_._M_string_length._4_4_ = 0;
        val.str_.field_2._M_allocated_capacity._0_4_ =
             (uint)(uint3)val.str_.field_2._M_allocated_capacity._1_3_ << 8;
        bVar2 = ReadBasicType(this,(AssetPath *)&val);
        if (bVar2) {
          linb::any::operator=((any *)&var,(AssetPath *)&val);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
          poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x36f);
          ::std::operator<<(poVar4," ");
          poVar4 = ::std::operator<<((ostream *)&metavar,"Failed to parse `asset`");
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&arrs);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
        }
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&val);
      }
      break;
    case 0x52:
      val.str_.field_2._8_8_ = &val.str_._M_string_length;
      val.str_._M_string_length._0_4_ = 0;
      val.str_.field_2._M_allocated_capacity._0_4_ = 0;
      val.str_.field_2._M_allocated_capacity._4_4_ = 0;
      bVar2 = ParseDict(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                              *)&val);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&var,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)&val);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
        poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x37a);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)&metavar,"Failed to parse `dictionary`");
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&arrs);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)&val);
    }
    if (bVar2 == false) {
LAB_002887e4:
      bVar2 = false;
    }
    else {
LAB_00288663:
      metavar._name._M_dataplus._M_p = (pointer)&metavar._name.field_2;
      metavar._value.v_.vtable =
           (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      metavar._value.v_.storage.dynamic = (void *)0x0;
      metavar._name._M_string_length = 0;
      metavar._name.field_2._M_local_buf[0] = '\0';
      MetaVariable::set_value<tinyusdz::value::Value>(&metavar,&key_name,&var._value);
      ::std::__cxx11::string::_M_assign((string *)out_key);
      MetaVariable::operator=(out_var,&metavar);
      MetaVariable::~MetaVariable(&metavar);
      bVar2 = true;
    }
    primvar::PrimVar::~PrimVar(&var);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&metavar);
    poVar4 = ::std::operator<<((ostream *)&metavar,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ParseDictElement");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x322);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)&metavar,"Failed to parse dictionary key identifier.\n");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,&val.str_);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&metavar);
LAB_00280bb4:
    bVar2 = false;
  }
  ::std::__cxx11::string::_M_dispose();
LAB_002809a5:
  ::std::__cxx11::string::_M_dispose();
  return bVar2;
}

Assistant:

bool AsciiParser::ParseDictElement(std::string *out_key,
                                   MetaVariable *out_var) {
  (void)out_key;
  (void)out_var;

  // dict_element: type (array_qual?) name '=' value
  //           ;

  std::string type_name;

  if (!ReadIdentifier(&type_name)) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!IsSupportedPrimAttrType(type_name)) {
    PUSH_ERROR_AND_RETURN("Unknown or unsupported type `" + type_name + "`\n");
  }

  // Has array qualifier? `[]`
  bool array_qual = false;
  {
    char c0, c1;
    if (!Char1(&c0)) {
      return false;
    }

    if (c0 == '[') {
      if (!Char1(&c1)) {
        return false;
      }

      if (c1 == ']') {
        array_qual = true;
      } else {
        // Invalid syntax
        PUSH_ERROR_AND_RETURN("Invalid syntax found.");
      }

    } else {
      if (!Rewind(1)) {
        return false;
      }
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  std::string key_name;
  if (!ReadIdentifier(&key_name)) {
    // string literal is also supported. e.g. "0"
    if (ReadStringLiteral(&key_name)) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse dictionary key identifier.\n");
    }
  }

  if (!SkipWhitespace()) {
    return false;
  }

  if (!Expect('=')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  uint32_t tyid = value::GetTypeId(type_name);

  primvar::PrimVar var;

  //
  // Supports limited types for customData/Dictionary.
  //

  // TODO: Unify code with ParseMetaValue()

#define PARSE_BASE_TYPE(__ty)                                     \
  case value::TypeTraits<__ty>::type_id(): {                      \
    if (array_qual) {                                             \
      std::vector<__ty> vss;                                      \
      if (!ParseBasicTypeArray(&vss)) {                           \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}[]`", \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(vss);                                         \
    } else {                                                      \
      __ty val;                                                   \
      if (!ReadBasicType(&val)) {                                 \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}`",   \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(val);                                         \
    }                                                             \
    break;                                                        \
  }

  switch (tyid) {
    APPLY_TO_METAVARIABLE_TYPE(PARSE_BASE_TYPE)
    case value::TYPE_ID_STRING: {
      // FIXME: Use std::string
      if (array_qual) {
        std::vector<value::StringData> strs;
        if (!ParseBasicTypeArray(&strs)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `string[]`");
        }
        var.set_value(strs);
      } else {
        value::StringData str;
        if (!ReadBasicType(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `string`");
        }
        var.set_value(str);
      }
      break;
    }
    case value::TYPE_ID_ASSET_PATH: {
      if (array_qual) {
        std::vector<value::AssetPath> arrs;
        if (!ParseBasicTypeArray(&arrs)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `asset[]`");
        }
        var.set_value(arrs);
      } else {
        value::AssetPath asset;
        if (!ReadBasicType(&asset)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `asset`");
        }
        var.set_value(asset);
      }
      break;
    }
    case value::TYPE_ID_DICT: {
      Dictionary dict;

      DCOUT("Parse dictionary");
      if (!ParseDict(&dict)) {
        PUSH_ERROR_AND_RETURN("Failed to parse `dictionary`");
      }
      var.set_value(dict);
      break;
    }
    default: {
      PUSH_ERROR_AND_RETURN("Unsupported or invalid type for Metadatum:" +
                            type_name);
    }
  }

#undef PARSE_BASE_TYPE

  MetaVariable metavar;
  metavar.set_value(key_name, var.value_raw());

  DCOUT("key: " << key_name << ", type: " << type_name);

  (*out_key) = key_name;
  (*out_var) = metavar;

  return true;
}